

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

strbuf * des3_decrypt_pubkey_wrapper(ptrlen key,ptrlen data)

{
  strbuf *psVar1;
  char *p;
  
  if (key.len == 0x10) {
    if (((undefined1  [16])data & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      psVar1 = strbuf_dup(data);
      des3_decrypt_pubkey(key.ptr,psVar1->u,(int)psVar1->len);
      return psVar1;
    }
    p = "des3_decrypt_pubkey: data must be a multiple of 8 bytes";
  }
  else {
    p = "des3_decrypt_pubkey: key must be 16 bytes long";
  }
  fatal_error(p);
}

Assistant:

strbuf *des3_decrypt_pubkey_wrapper(ptrlen key, ptrlen data)
{
    if (key.len != 16)
        fatal_error("des3_decrypt_pubkey: key must be 16 bytes long");
    if (data.len % 8 != 0)
        fatal_error("des3_decrypt_pubkey: data must be a multiple of 8 bytes");
    strbuf *sb = strbuf_dup(data);
    des3_decrypt_pubkey(key.ptr, sb->u, sb->len);
    return sb;
}